

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.cpp
# Opt level: O1

void __thiscall xmrig::OclThread::OclThread(OclThread *this,Value *value)

{
  vector<long,_std::allocator<long>_> *this_00;
  Ch *pCVar1;
  iterator iVar2;
  uint uVar3;
  uint uVar4;
  Value *pVVar5;
  long lVar6;
  ulong uVar7;
  int local_3c;
  long local_38;
  
  this->m_datasetHost = false;
  this->m_gcnAsm = true;
  (this->m_fields).super__Base_bitset<1UL>._M_w = 1;
  (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_bfactor = 6;
  this->m_index = 0;
  this->m_intensity = 0;
  this->m_memChunk = 2;
  this->m_stridedIndex = 2;
  this->m_unrollFactor = 8;
  this->m_worksize = 0;
  if ((value->data_).f.flags == 3) {
    this_00 = &this->m_threads;
    uVar3 = Json::getUint(value,"index",0);
    this->m_index = uVar3;
    uVar3 = Json::getUint(value,"worksize",0);
    if (0x7f < uVar3) {
      uVar3 = 0x80;
    }
    this->m_worksize = uVar3 + (uVar3 == 0);
    uVar4 = Json::getUint(value,"unroll",this->m_unrollFactor);
    uVar3 = 0x80;
    if (uVar4 < 0x80) {
      uVar3 = uVar4;
    }
    this->m_unrollFactor = uVar3 + (uVar3 == 0);
    uVar3 = Json::getUint(value,"intensity",0);
    this->m_intensity = uVar3 - uVar3 % this->m_worksize;
    pVVar5 = Json::getArray(value,"strided_index");
    if (((pVVar5->data_).f.flags == 4) && (1 < (pVVar5->data_).s.length)) {
      uVar3 = *(uint *)((ulong)(pVVar5->data_).s.str & 0xffffffffffff);
      uVar4 = 2;
      if (uVar3 < 2) {
        uVar4 = uVar3;
      }
      this->m_stridedIndex = uVar4;
      uVar3 = *(uint *)(((ulong)(pVVar5->data_).s.str & 0xffffffffffff) + 0x10);
      uVar4 = 0x12;
      if (uVar3 < 0x12) {
        uVar4 = uVar3;
      }
      this->m_memChunk = uVar4;
    }
    else {
      this->m_memChunk = 0;
      this->m_stridedIndex = 0;
      *(byte *)&(this->m_fields).super__Base_bitset<1UL>._M_w =
           (byte)(this->m_fields).super__Base_bitset<1UL>._M_w & 0xfe;
    }
    pVVar5 = Json::getArray(value,"threads");
    if ((pVVar5->data_).f.flags == 4) {
      std::vector<long,_std::allocator<long>_>::reserve(this_00,(ulong)(pVVar5->data_).s.length);
      uVar7 = (ulong)(pVVar5->data_).s.length;
      if (uVar7 != 0) {
        pCVar1 = (pVVar5->data_).s.str;
        lVar6 = 0;
        do {
          local_38 = *(long *)(((ulong)pCVar1 & 0xffffffffffff) + lVar6);
          iVar2._M_current =
               (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (this_00,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = local_38;
            (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          lVar6 = lVar6 + 0x10;
        } while (uVar7 << 4 != lVar6);
      }
    }
    iVar2._M_current =
         (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start == iVar2._M_current) {
      local_3c = -1;
      if (iVar2._M_current ==
          (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<int>(this_00,iVar2,&local_3c);
      }
      else {
        *iVar2._M_current = -1;
        (this->m_threads).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

xmrig::OclThread::OclThread(const rapidjson::Value &value)
{
    if (!value.IsObject()) {
        return;
    }

    m_index         = Json::getUint(value, kIndex);
    m_worksize      = std::max(std::min(Json::getUint(value, kWorksize), 128u), 1u);
    m_unrollFactor  = std::max(std::min(Json::getUint(value, kUnroll, m_unrollFactor), 128u), 1u);

    setIntensity(Json::getUint(value, kIntensity));

    const auto &si = Json::getArray(value, kStridedIndex);
    if (si.IsArray() && si.Size() >= 2) {
        m_stridedIndex = std::min(si[0].GetUint(), 2u);
        m_memChunk     = std::min(si[1].GetUint(), 18u);
    }
    else {
        m_stridedIndex = 0;
        m_memChunk     = 0;
        m_fields.set(STRIDED_INDEX_FIELD, false);
    }

    const auto &threads = Json::getArray(value, kThreads);
    if (threads.IsArray()) {
        m_threads.reserve(threads.Size());

        for (const auto &affinity : threads.GetArray()) {
            m_threads.emplace_back(affinity.GetInt64());
        }
    }

    if (m_threads.empty()) {
        m_threads.emplace_back(-1);
    }
}